

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

void __thiscall OpenMD::Stats::~Stats(Stats *this)

{
  pointer pSVar1;
  pointer pSVar2;
  
  this->_vptr_Stats = (_func_int **)&PTR__Stats_002c2d58;
  pSVar1 = (this->data_).
           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar2 = (this->data_).
                super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    if ((pSVar2->accumulatorArray2d).
        super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pSVar2->accumulatorArray2d).
        super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (pSVar2->accumulator != (BaseAccumulator *)0x0) {
        (*pSVar2->accumulator->_vptr_BaseAccumulator[3])();
      }
    }
    else {
      Utils::
      deletePointers<std::vector<OpenMD::BaseAccumulator*,std::allocator<OpenMD::BaseAccumulator*>>>
                (&pSVar2->accumulatorArray2d);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
  ::~_Rb_tree(&(this->statsMap_)._M_t);
  std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::~vector
            (&this->data_);
  return;
}

Assistant:

Stats::~Stats() {
    for (auto& data : data_) {
      if (!data.accumulatorArray2d.empty())
        Utils::deletePointers(data.accumulatorArray2d);
      else
        delete data.accumulator;
    }
  }